

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin.cpp
# Opt level: O3

void __thiscall Jupiter::Plugin::setDirectory(Plugin *this,string_view dir)

{
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&plugins_directory_abi_cxx11_,0,plugins_directory_abi_cxx11_._M_string_length,
             (char *)dir._M_len,(size_type)this);
  if ((plugins_directory_abi_cxx11_._M_string_length != 0) &&
     (plugins_directory_abi_cxx11_._M_dataplus._M_p
      [plugins_directory_abi_cxx11_._M_string_length - 1] != '/')) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&plugins_directory_abi_cxx11_,'/');
    return;
  }
  return;
}

Assistant:

void Jupiter::Plugin::setDirectory(std::string_view dir) {
	plugins_directory = dir;
	if (!plugins_directory.empty() && plugins_directory.back() != directory_character) {
		plugins_directory += directory_character;
	}
}